

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::TransformerLinLog>::operator()
          (StairsRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  ImVec2 IVar4;
  ushort uVar5;
  int iVar6;
  ImU32 IVar7;
  GetterXsYs<unsigned_short> *pGVar8;
  TransformerLinLog *pTVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  uint *puVar12;
  ImPlotContext *pIVar13;
  bool bVar14;
  long lVar15;
  double dVar16;
  ImVec2 IVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  pIVar13 = GImPlot;
  pGVar8 = this->Getter;
  pTVar9 = this->Transformer;
  iVar6 = pGVar8->Count;
  lVar15 = (long)(((pGVar8->Offset + prim + 1) % iVar6 + iVar6) % iVar6) * (long)pGVar8->Stride;
  uVar5 = *(ushort *)((long)pGVar8->Xs + lVar15);
  dVar16 = log10((double)*(ushort *)((long)pGVar8->Ys + lVar15) /
                 GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  iVar6 = pTVar9->YAxis;
  pIVar10 = pIVar13->CurrentPlot;
  dVar3 = pIVar10->YAxis[iVar6].Range.Min;
  IVar17.x = (float)(((double)uVar5 - (pIVar10->XAxis).Range.Min) * pIVar13->Mx +
                    (double)pIVar13->PixelRange[iVar6].Min.x);
  fVar18 = (float)((((double)(float)(dVar16 / pIVar13->LogDenY[iVar6]) *
                     (pIVar10->YAxis[iVar6].Range.Max - dVar3) + dVar3) - dVar3) *
                   pIVar13->My[iVar6] + (double)pIVar13->PixelRange[iVar6].Min.y);
  fVar2 = (this->P1).x;
  fVar19 = (this->P1).y;
  fVar20 = fVar19;
  if (fVar18 <= fVar19) {
    fVar20 = fVar18;
  }
  bVar14 = false;
  if ((fVar20 < (cull_rect->Max).y) &&
     (fVar19 = (float)(-(uint)(fVar18 <= fVar19) & (uint)fVar19 |
                      ~-(uint)(fVar18 <= fVar19) & (uint)fVar18), pfVar1 = &(cull_rect->Min).y,
     bVar14 = false, *pfVar1 <= fVar19 && fVar19 != *pfVar1)) {
    fVar19 = fVar2;
    if (IVar17.x <= fVar2) {
      fVar19 = IVar17.x;
    }
    if (fVar19 < (cull_rect->Max).x) {
      fVar19 = (float)(~-(uint)(IVar17.x <= fVar2) & (uint)IVar17.x |
                      -(uint)(IVar17.x <= fVar2) & (uint)fVar2);
      bVar14 = (cull_rect->Min).x <= fVar19 && fVar19 != (cull_rect->Min).x;
    }
  }
  if (bVar14 != false) {
    fVar19 = (this->P1).y;
    fVar20 = fVar19 + this->HalfWeight;
    fVar19 = fVar19 - this->HalfWeight;
    IVar7 = this->Col;
    IVar4 = *uv;
    pIVar11 = DrawList->_VtxWritePtr;
    (pIVar11->pos).x = fVar2;
    (pIVar11->pos).y = fVar20;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar7;
    pIVar11[1].pos.x = IVar17.x;
    pIVar11[1].pos.y = fVar19;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar7;
    pIVar11[2].pos.x = fVar2;
    pIVar11[2].pos.y = fVar19;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar7;
    pIVar11[3].pos.x = IVar17.x;
    pIVar11[3].pos.y = fVar20;
    pIVar11[3].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    puVar12 = DrawList->_IdxWritePtr;
    *puVar12 = DrawList->_VtxCurrentIdx;
    puVar12[1] = DrawList->_VtxCurrentIdx + 1;
    puVar12[2] = DrawList->_VtxCurrentIdx + 2;
    puVar12[3] = DrawList->_VtxCurrentIdx;
    puVar12[4] = DrawList->_VtxCurrentIdx + 1;
    puVar12[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar12 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar20 = IVar17.x - this->HalfWeight;
    fVar19 = this->HalfWeight + IVar17.x;
    fVar2 = (this->P1).y;
    IVar7 = this->Col;
    IVar4 = *uv;
    pIVar11[4].pos.x = fVar20;
    pIVar11[4].pos.y = fVar18;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar7;
    pIVar11[1].pos.x = fVar19;
    pIVar11[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar7;
    pIVar11[2].pos.x = fVar20;
    pIVar11[2].pos.y = fVar2;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar7;
    pIVar11[3].pos.x = fVar19;
    pIVar11[3].pos.y = fVar18;
    pIVar11[3].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    puVar12 = DrawList->_IdxWritePtr;
    *puVar12 = DrawList->_VtxCurrentIdx;
    puVar12[1] = DrawList->_VtxCurrentIdx + 1;
    puVar12[2] = DrawList->_VtxCurrentIdx + 2;
    puVar12[3] = DrawList->_VtxCurrentIdx;
    puVar12[4] = DrawList->_VtxCurrentIdx + 1;
    puVar12[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar12 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar17.y = fVar18;
  this->P1 = IVar17;
  return bVar14;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }